

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  vector<LayerInfo,_std::allocator<LayerInfo>_> info;
  MatrixXd result;
  DenseStorage<double,__1,__1,__1,_0> local_2f0;
  DenseStorage<double,__1,__1,__1,_0> local_2d8;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> data;
  HJNN hjnn;
  
  info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hjnn.layers.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&info,(int *)&hjnn,&LINEAR);
  hjnn.layers.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&info,(int *)&hjnn,&SIGMOID);
  hjnn.layers.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 1;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&info,(int *)&hjnn,&LINEAR);
  HJNN::HJNN(&hjnn,&info);
  genrate2ClassNormalData2d(&data,-5.0,2.0,1.0,6.0,-2.0,1.0,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_2d8,(DenseStorage<double,__1,__1,__1,_0> *)&data);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_2f0,(DenseStorage<double,__1,__1,__1,_0> *)&data.second);
  HJNN::train(&hjnn,(MatrixXd *)&local_2d8,(MatrixXd *)&local_2f0,0.001,100,0.1);
  free(local_2f0.m_data);
  free(local_2d8.m_data);
  HJNN::printNetInfo(&hjnn);
  HJNN::predict(&result,&hjnn,&data.first);
  poVar1 = std::operator<<((ostream *)&std::cout,"original data:\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&data);
  poVar1 = std::operator<<(poVar1,"\ntruth:");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &data.second);
  poVar1 = std::operator<<(poVar1,"\npredict:");
  Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&result);
  free(result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  ~pair(&data);
  HJNN::~HJNN(&hjnn);
  std::_Vector_base<LayerInfo,_std::allocator<LayerInfo>_>::~_Vector_base
            (&info.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>);
  return 0;
}

Assistant:

int main() {
	vector<LayerInfo> info;
	info.emplace_back(2,LINEAR);
	info.emplace_back(2,SIGMOID);
	info.emplace_back(1,LINEAR);
	HJNN hjnn(info);
	auto data=genrate2ClassNormalData2d(-5,2,1,6,-2,1,20);
	hjnn.train(data.first,data.second,0.001,100,0.1);
	hjnn.printNetInfo();
	auto result=hjnn.predict(data.first);
	cout<<"original data:\n"<<data.first<<"\ntruth:"<<data.second<<"\npredict:"<<result;
//	if(hjnn.saveModel("normal.model"))cout<<"\nsave successfully!";
	return 0;
}